

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O0

int adh_init(char *input_file_name,char *output_file_name,FILE **output_file_ptr,
            FILE **input_file_ptr)

{
  FILE *pFVar1;
  undefined4 local_2c;
  int rc;
  FILE **input_file_ptr_local;
  FILE **output_file_ptr_local;
  char *output_file_name_local;
  char *input_file_name_local;
  
  local_2c = init_tree();
  if (local_2c == 0) {
    hash_init();
  }
  pFVar1 = bin_open_read(input_file_name);
  *input_file_ptr = pFVar1;
  if (*input_file_ptr == (FILE *)0x0) {
    local_2c = 1;
  }
  if (local_2c == 0) {
    pFVar1 = bin_open_create(output_file_name);
    *output_file_ptr = pFVar1;
    if (*output_file_ptr == (FILE *)0x0) {
      local_2c = 1;
    }
  }
  return local_2c;
}

Assistant:

int adh_init(const char input_file_name[], const char output_file_name[],
             FILE **output_file_ptr, FILE **input_file_ptr) {
    int rc = init_tree();
    if(rc == RC_OK) {
        hash_init();
    }

    *input_file_ptr = bin_open_read(input_file_name);
    if ((*input_file_ptr) == NULL) {
        rc = RC_FAIL;
    }

    if(rc == RC_OK) {
        (*output_file_ptr) = bin_open_create(output_file_name);
        if ((*output_file_ptr) == NULL) {
            rc = RC_FAIL;
        }
    }

    return rc;
}